

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O2

void __thiscall
burst::subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::subsequence_iterator
          (subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           *this,char *first,char *last)

{
  allocator_type local_11;
  
  this->m_begin = first;
  this->m_end = last;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&this->m_subsequence,(long)last - (long)first,&local_11);
  this->m_subsequence_size = 0;
  increment(this);
  return;
}

Assistant:

subsequence_iterator (ForwardIterator first, ForwardIterator last):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subsequence(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subsequence_size(0)
        {
            increment();
        }